

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Queries::FunctionalTest::checkXFB(FunctionalTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  int *piVar5;
  GLint *buffer;
  bool is_ok;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  buffer._7_1_ = true;
  piVar5 = (int *)(**(code **)(lVar4 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,2000);
  if ((((*piVar5 != 0) || (piVar5[1] != 1)) || (piVar5[2] != 2)) ||
     (((piVar5[3] != 2 || (piVar5[4] != 1)) || (piVar5[5] != 3)))) {
    buffer._7_1_ = false;
  }
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x7da);
  return buffer._7_1_;
}

Assistant:

bool FunctionalTest::checkXFB()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default result. */
	bool is_ok = true;

	/* Mapping buffer object to the user-space. */
	glw::GLint* buffer = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	if ((0 != buffer[0]) || (1 != buffer[1]) || (2 != buffer[2]) ||

		(2 != buffer[3]) || (1 != buffer[4]) || (3 != buffer[5]))
	{
		is_ok = false;
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}